

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.cc
# Opt level: O1

bool __thiscall
OpenMesh::IO::_OMReader_::read_binary_vertex_chunk
          (_OMReader_ *this,istream *_is,BaseImporter *_bi,Options *_opt,bool _swap)

{
  value_type_conflict4 *_val;
  ChunkHeader CVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  mostream *pmVar5;
  size_t sVar6;
  size_t sVar7;
  undefined4 extraout_var;
  BaseProperty *_bp;
  size_t sVar8;
  ulong uVar9;
  PropertyName custom_prop;
  Vec2f v2f;
  value_type_conflict4 local_54;
  value_type_conflict4 local_50;
  Vec3f v3f;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  _OMReader_ *p_Stack_38;
  Vec3uc v3uc;
  
  CVar1 = this->chunk_header_;
  v3f.super_VectorDataT<float,_3>.values_._4_8_ = _bi;
  if (((uint)CVar1 & 0x1c) != 0) {
    __assert_fail("chunk_header_.entity_ == Chunk::Entity_Vertex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                  ,0x119,
                  "bool OpenMesh::IO::_OMReader_::read_binary_vertex_chunk(std::istream &, BaseImporter &, Options &, bool) const"
                 );
  }
  custom_prop.super_string._M_dataplus._M_p = (pointer)0x0;
  custom_prop.super_string._M_string_length._0_1_ = 0;
  p_Stack_38 = this;
  switch((uint)CVar1 >> 5 & 0xf) {
  case 0:
    if (((uint)CVar1 & 0x3800) != 0x1000) {
      __assert_fail("OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec3f::dim())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                    ,0x124,
                    "bool OpenMesh::IO::_OMReader_::read_binary_vertex_chunk(std::istream &, BaseImporter &, Options &, bool) const"
                   );
    }
    if ((this->header_).n_vertices_ != 0) {
      uVar9 = 0;
      do {
        if (((byte)_is[*(long *)(*(long *)_is + -0x18) + 0x20] & 2) != 0) break;
        sVar8 = binary<float>::restore(_is,&local_54,_swap);
        sVar6 = binary<float>::restore(_is,&local_50,_swap);
        sVar7 = binary<float>::restore(_is,(value_type_conflict4 *)&v3f,_swap);
        p_Stack_38->bytes_ = p_Stack_38->bytes_ + sVar6 + sVar8 + sVar7;
        (**(code **)(*(long *)v3f.super_VectorDataT<float,_3>.values_._4_8_ + 0x10))
                  (v3f.super_VectorDataT<float,_3>.values_._4_8_,&local_54);
        uVar9 = uVar9 + 1;
      } while (uVar9 < (p_Stack_38->header_).n_vertices_);
      goto LAB_001791d4;
    }
    break;
  case 1:
    if (((uint)CVar1 & 0x3800) != 0x1000) {
      __assert_fail("OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec3f::dim())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                    ,0x12d,
                    "bool OpenMesh::IO::_OMReader_::read_binary_vertex_chunk(std::istream &, BaseImporter &, Options &, bool) const"
                   );
    }
    *(byte *)&(this->fileOptions_).flags_ = (byte)(this->fileOptions_).flags_ | 0x10;
    if ((this->header_).n_vertices_ != 0) {
      uVar9 = 0;
      do {
        if (((byte)_is[*(long *)(*(long *)_is + -0x18) + 0x20] & 2) != 0) break;
        sVar8 = binary<float>::restore(_is,&local_54,_swap);
        sVar6 = binary<float>::restore(_is,&local_50,_swap);
        sVar7 = binary<float>::restore(_is,(value_type_conflict4 *)&v3f,_swap);
        p_Stack_38->bytes_ = p_Stack_38->bytes_ + sVar6 + sVar8 + sVar7;
        if ((((p_Stack_38->fileOptions_).flags_ & 0x10) != 0) && ((_opt->flags_ & 0x10) != 0)) {
          (**(code **)(*(long *)v3f.super_VectorDataT<float,_3>.values_._4_8_ + 0x40))
                    (v3f.super_VectorDataT<float,_3>.values_._4_8_,uVar9 & 0xffffffff,&local_54);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < (p_Stack_38->header_).n_vertices_);
      goto LAB_001791d4;
    }
    break;
  case 2:
    if (((uint)CVar1 & 0x3800) != 0x800) {
      __assert_fail("OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec2f::dim())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                    ,0x138,
                    "bool OpenMesh::IO::_OMReader_::read_binary_vertex_chunk(std::istream &, BaseImporter &, Options &, bool) const"
                   );
    }
    *(byte *)&(this->fileOptions_).flags_ = (byte)(this->fileOptions_).flags_ | 0x40;
    if ((this->header_).n_vertices_ != 0) {
      uVar9 = 0;
      _val = (value_type_conflict4 *)((long)&custom_prop.super_string.field_2 + 8);
      do {
        if (((byte)_is[*(long *)(*(long *)_is + -0x18) + 0x20] & 2) != 0) break;
        sVar8 = binary<float>::restore(_is,_val,_swap);
        sVar6 = binary<float>::restore
                          (_is,(value_type_conflict4 *)
                               ((long)&custom_prop.super_string.field_2 + 0xc),_swap);
        p_Stack_38->bytes_ = p_Stack_38->bytes_ + sVar6 + sVar8;
        if ((((p_Stack_38->fileOptions_).flags_ & 0x40) != 0) && ((_opt->flags_ & 0x40) != 0)) {
          (**(code **)(*(long *)v3f.super_VectorDataT<float,_3>.values_._4_8_ + 0x68))
                    (v3f.super_VectorDataT<float,_3>.values_._4_8_,uVar9 & 0xffffffff,_val);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < (p_Stack_38->header_).n_vertices_);
      goto LAB_001791d4;
    }
    break;
  default:
    pmVar5 = omerr();
    std::__ostream_insert<char,std::char_traits<char>>
              (&pmVar5->super_ostream,"Unknown chunk type ignored!\n",0x1c);
    uVar2 = (this->header_).n_vertices_;
    CVar1 = this->chunk_header_;
    std::istream::ignore((long)_is);
    this->bytes_ = this->bytes_ +
                   (((ulong)((uint)CVar1 >> 0xb & 7) + 1) * (ulong)uVar2 <<
                   ((byte)(~(uint)CVar1 >> 9) & 2) + ((byte)((uint)CVar1 >> 0xe) & 3));
    break;
  case 4:
    if (((uint)CVar1 & 0x3800) != 0x1000) {
      __assert_fail("OMFormat::dimensions(chunk_header_) == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                    ,0x144,
                    "bool OpenMesh::IO::_OMReader_::read_binary_vertex_chunk(std::istream &, BaseImporter &, Options &, bool) const"
                   );
    }
    *(byte *)&(this->fileOptions_).flags_ = (byte)(this->fileOptions_).flags_ | 0x20;
    if ((this->header_).n_vertices_ != 0) {
      uVar9 = 0;
      do {
        if (((byte)_is[*(long *)(*(long *)_is + -0x18) + 0x20] & 2) != 0) break;
        std::istream::read((char *)_is,(long)&local_3b);
        iVar4 = *(int *)(_is + *(long *)(*(long *)_is + -0x18) + 0x20);
        std::istream::read((char *)_is,(long)&local_3a);
        iVar3 = *(int *)(_is + *(long *)(*(long *)_is + -0x18) + 0x20);
        std::istream::read((char *)_is,(long)&local_39);
        p_Stack_38->bytes_ =
             p_Stack_38->bytes_ + (ulong)(iVar3 == 0) + (ulong)(iVar4 == 0) +
             (ulong)(*(int *)(_is + *(long *)(*(long *)_is + -0x18) + 0x20) == 0);
        if ((((p_Stack_38->fileOptions_).flags_ & 0x20) != 0) && ((_opt->flags_ & 0x20) != 0)) {
          (**(code **)(*(long *)v3f.super_VectorDataT<float,_3>.values_._4_8_ + 0x48))
                    (v3f.super_VectorDataT<float,_3>.values_._4_8_,uVar9 & 0xffffffff,&local_3b);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < (p_Stack_38->header_).n_vertices_);
      goto LAB_001791d4;
    }
    break;
  case 6:
    iVar4 = (*_bi->_vptr_BaseImporter[0x19])();
    _bp = PropertyContainer::property
                    ((PropertyContainer *)(CONCAT44(extraout_var,iVar4) + 8),
                     &(this->property_name_).super_string);
    sVar8 = restore_binary_custom_data(this,_is,_bp,(ulong)(this->header_).n_vertices_,_swap);
    this->bytes_ = this->bytes_ + sVar8;
    uVar9 = (ulong)(this->header_).n_vertices_;
    goto LAB_001791d4;
  }
  uVar9 = 0;
LAB_001791d4:
  return uVar9 == (p_Stack_38->header_).n_vertices_;
}

Assistant:

bool _OMReader_::read_binary_vertex_chunk(std::istream &_is, BaseImporter &_bi, Options &_opt, bool _swap) const
{
  using OMFormat::Chunk;

  assert( chunk_header_.entity_ == Chunk::Entity_Vertex);

  OpenMesh::Vec3f v3f;
  OpenMesh::Vec2f v2f;
  OpenMesh::Vec3uc v3uc; // rgb

  OMFormat::Chunk::PropertyName custom_prop;

  size_t vidx = 0;
  switch (chunk_header_.type_) {
    case Chunk::Type_Pos:
      assert( OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec3f::dim()));

      for (; vidx < header_.n_vertices_ && !_is.eof(); ++vidx) {
        bytes_ += vector_restore(_is, v3f, _swap);
        _bi.add_vertex(v3f);
      }
      break;

    case Chunk::Type_Normal:
      assert( OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec3f::dim()));

      fileOptions_ += Options::VertexNormal;
      for (; vidx < header_.n_vertices_ && !_is.eof(); ++vidx) {
        bytes_ += vector_restore(_is, v3f, _swap);
        if (fileOptions_.vertex_has_normal() && _opt.vertex_has_normal())
          _bi.set_normal(VertexHandle(int(vidx)), v3f);
      }
      break;

    case Chunk::Type_Texcoord:
      assert( OMFormat::dimensions(chunk_header_) == size_t(OpenMesh::Vec2f::dim()));

      fileOptions_ += Options::VertexTexCoord;
      for (; vidx < header_.n_vertices_ && !_is.eof(); ++vidx) {
        bytes_ += vector_restore(_is, v2f, _swap);
        if (fileOptions_.vertex_has_texcoord() && _opt.vertex_has_texcoord())
          _bi.set_texcoord(VertexHandle(int(vidx)), v2f);
      }
      break;

    case Chunk::Type_Color:

      assert( OMFormat::dimensions(chunk_header_) == 3);

      fileOptions_ += Options::VertexColor;

      for (; vidx < header_.n_vertices_ && !_is.eof(); ++vidx) {
        bytes_ += vector_restore(_is, v3uc, _swap);
        if (fileOptions_.vertex_has_color() && _opt.vertex_has_color())
          _bi.set_color(VertexHandle(int(vidx)), v3uc);
      }
      break;

    case Chunk::Type_Custom:

      bytes_ += restore_binary_custom_data(_is, _bi.kernel()->_get_vprop(property_name_), header_.n_vertices_, _swap);

      vidx = header_.n_vertices_;

      break;

    default: // skip unknown chunks
    {
      omerr() << "Unknown chunk type ignored!\n";
      size_t size_of = header_.n_vertices_ * OMFormat::vector_size(chunk_header_);
      _is.ignore(size_of);
      bytes_ += size_of;
    }
  }

  // all chunk data has been read..?!
  return vidx == header_.n_vertices_;
}